

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

BorderStyle parseStyleValue(Value *v)

{
  undefined4 uVar1;
  int *in_RDI;
  BorderStyle local_4;
  
  if (*in_RDI == 6) {
    uVar1 = QVariant::toInt((bool *)(in_RDI + 2));
    switch(uVar1) {
    case 0x18:
      local_4 = BorderStyle_Native;
      break;
    case 0x19:
      local_4 = BorderStyle_Solid;
      break;
    case 0x1a:
      local_4 = BorderStyle_Dotted;
      break;
    case 0x1b:
      local_4 = BorderStyle_Dashed;
      break;
    case 0x1c:
      local_4 = BorderStyle_DotDash;
      break;
    case 0x1d:
      local_4 = BorderStyle_DotDotDash;
      break;
    case 0x1e:
      local_4 = BorderStyle_Double;
      break;
    case 0x1f:
      local_4 = BorderStyle_Groove;
      break;
    case 0x20:
      local_4 = BorderStyle_Ridge;
      break;
    case 0x21:
      local_4 = BorderStyle_Inset;
      break;
    case 0x22:
      local_4 = BorderStyle_Outset;
      break;
    default:
      goto LAB_00a3089c;
    case 0x27:
      local_4 = BorderStyle_None;
    }
  }
  else {
LAB_00a3089c:
    local_4 = BorderStyle_Unknown;
  }
  return local_4;
}

Assistant:

static BorderStyle parseStyleValue(const QCss::Value &v)
{
    if (v.type == Value::KnownIdentifier) {
        switch (v.variant.toInt()) {
        case Value_None:
            return BorderStyle_None;
        case Value_Dotted:
            return BorderStyle_Dotted;
        case Value_Dashed:
            return BorderStyle_Dashed;
        case Value_Solid:
            return BorderStyle_Solid;
        case Value_Double:
            return BorderStyle_Double;
        case Value_DotDash:
            return BorderStyle_DotDash;
        case Value_DotDotDash:
            return BorderStyle_DotDotDash;
        case Value_Groove:
            return BorderStyle_Groove;
        case Value_Ridge:
            return BorderStyle_Ridge;
        case Value_Inset:
            return BorderStyle_Inset;
        case Value_Outset:
            return BorderStyle_Outset;
        case Value_Native:
            return BorderStyle_Native;
        default:
            break;
        }
    }

    return BorderStyle_Unknown;
}